

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O0

void __thiscall QScanConverter::scanConvert<true>(QScanConverter *this)

{
  qsizetype qVar1;
  Line *pLVar2;
  Line *pLVar3;
  Line **ppLVar4;
  QDataBuffer<QScanConverter::Line> *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  int j_1;
  int current;
  Line *node;
  int i;
  int winding;
  int x;
  int numActive;
  int j;
  Line *l;
  int y;
  int line;
  anon_class_1_0_00000001 xOrder;
  anon_class_1_0_00000001 topOrder;
  qsizetype in_stack_ffffffffffffff48;
  Line *in_stack_ffffffffffffff50;
  Line *in_stack_ffffffffffffff58;
  QSpanBuffer *in_stack_ffffffffffffff60;
  bool local_89;
  int local_58;
  int local_44;
  uint local_40;
  int local_38;
  int local_34;
  int local_24;
  int local_20;
  anon_class_1_0_00000001 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QDataBuffer<QScanConverter::Line>::size(in_RDI);
  if (qVar1 == 0) {
    QDataBuffer<QScanConverter::Line_*>::reset
              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
  }
  else {
    local_9 = 0;
    local_a = (anon_class_1_0_00000001)0x0;
    pLVar2 = QDataBuffer<QScanConverter::Line>::data(in_RDI);
    pLVar3 = QDataBuffer<QScanConverter::Line>::data(in_RDI);
    qVar1 = QDataBuffer<QScanConverter::Line>::size(in_RDI);
    std::
    sort<QScanConverter::Line*,QScanConverter::scanConvert<true>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>
              (pLVar2,pLVar3 + qVar1);
    local_20 = 0;
    pLVar2 = QDataBuffer<QScanConverter::Line>::first(in_RDI);
    for (local_24 = pLVar2->top; local_24 <= *(int *)((long)&in_RDI[1].siz + 4);
        local_24 = local_24 + 1) {
      while( true ) {
        qVar1 = QDataBuffer<QScanConverter::Line>::size(in_RDI);
        bVar5 = false;
        if (local_20 < qVar1) {
          pLVar2 = QDataBuffer<QScanConverter::Line>::at(in_RDI,(long)local_20);
          bVar5 = pLVar2->top == local_24;
        }
        if (!bVar5) break;
        in_stack_ffffffffffffff58 = QDataBuffer<QScanConverter::Line>::at(in_RDI,(long)local_20);
        QDataBuffer<QScanConverter::Line_*>::size
                  ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
        QDataBuffer<QScanConverter::Line_*>::resize
                  ((QDataBuffer<QScanConverter::Line_*> *)in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff48);
        qVar1 = QDataBuffer<QScanConverter::Line_*>::size
                          ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
        local_34 = (int)qVar1 + -2;
        while( true ) {
          local_89 = false;
          if (-1 < local_34) {
            ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                                ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                                 (long)local_34);
            local_89 = scanConvert<true>::anon_class_1_0_00000001::operator()
                                 (&local_a,in_stack_ffffffffffffff58,*ppLVar4);
          }
          if (local_89 == false) break;
          ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                               (long)local_34);
          in_stack_ffffffffffffff60 = (QSpanBuffer *)*ppLVar4;
          ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                               (long)(local_34 + 1));
          *ppLVar4 = (Line *)in_stack_ffffffffffffff60;
          local_34 = local_34 + -1;
        }
        ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                            ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                             (long)(local_34 + 1));
        *ppLVar4 = in_stack_ffffffffffffff58;
        local_20 = local_20 + 1;
      }
      qVar1 = QDataBuffer<QScanConverter::Line_*>::size
                        ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
      local_38 = (int)qVar1;
      local_40 = 0;
      for (local_44 = 0; local_44 < local_38; local_44 = local_44 + 1) {
        ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                            ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,(long)local_44
                            );
        pLVar2 = *ppLVar4;
        if ((local_40 & (uint)in_RDI[2].siz) != 0) {
          QSpanBuffer::addSpan
                    (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (int)in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (int)in_stack_ffffffffffffff50);
        }
        local_40 = pLVar2->winding + local_40;
        if (pLVar2->bottom == local_24) {
          for (local_58 = local_44; local_58 < local_38 + -1; local_58 = local_58 + 1) {
            ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                                ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                                 (long)(local_58 + 1));
            in_stack_ffffffffffffff50 = *ppLVar4;
            ppLVar4 = QDataBuffer<QScanConverter::Line_*>::at
                                ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer,
                                 (long)local_58);
            *ppLVar4 = in_stack_ffffffffffffff50;
          }
          local_38 = local_38 + -1;
          QDataBuffer<QScanConverter::Line_*>::resize
                    ((QDataBuffer<QScanConverter::Line_*> *)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
          local_44 = local_44 + -1;
        }
      }
    }
    QDataBuffer<QScanConverter::Line_*>::reset
              ((QDataBuffer<QScanConverter::Line_*> *)&in_RDI[3].buffer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}